

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_property.cpp
# Opt level: O0

int MeCab::anon_unknown_3::atohex(char *s)

{
  size_t sVar1;
  ostream *poVar2;
  char *in_RDI;
  int r;
  char *p;
  int n;
  die local_2d;
  int local_2c;
  char *local_28;
  byte local_e;
  die local_d;
  int local_c;
  char *local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  sVar1 = strlen(in_RDI);
  local_e = 0;
  if (((sVar1 < 3) || (*local_8 != '0')) || ((local_8[1] != 'x' && (local_8[1] != 'X')))) {
    die::die(&local_d);
    local_e = 1;
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                            );
    poVar2 = std::operator<<(poVar2,"(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x1e);
    poVar2 = std::operator<<(poVar2,") [");
    poVar2 = std::operator<<(poVar2,
                             "std::strlen(s) >= 3 && s[0] == \'0\' && (s[1] == \'x\' || s[1] == \'X\')"
                            );
    poVar2 = std::operator<<(poVar2,"] ");
    poVar2 = std::operator<<(poVar2,"no hex value: ");
    poVar2 = std::operator<<(poVar2,local_8);
    die::operator&(&local_d,poVar2);
  }
  if ((local_e & 1) != 0) {
    die::~die((die *)0x14bbd3);
  }
  local_28 = local_8;
  for (local_8 = local_8 + 2; *local_8 != '\0'; local_8 = local_8 + 1) {
    local_2c = 0;
    if ((*local_8 < '0') || ('9' < *local_8)) {
      if ((*local_8 < 'A') || ('F' < *local_8)) {
        if ((*local_8 < 'a') || ('f' < *local_8)) {
          die::die(&local_2d);
          poVar2 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/char_property.cpp"
                                  );
          poVar2 = std::operator<<(poVar2,"(");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2c);
          poVar2 = std::operator<<(poVar2,") [");
          poVar2 = std::operator<<(poVar2,"false");
          poVar2 = std::operator<<(poVar2,"] ");
          poVar2 = std::operator<<(poVar2,"no hex value: ");
          poVar2 = std::operator<<(poVar2,local_28);
          die::operator&(&local_2d,poVar2);
          die::~die((die *)0x14bde6);
        }
        else {
          local_2c = *local_8 + -0x57;
        }
      }
      else {
        local_2c = *local_8 + -0x37;
      }
    }
    else {
      local_2c = *local_8 + -0x30;
    }
    local_c = local_c * 0x10 + local_2c;
  }
  return local_c;
}

Assistant:

int atohex(const char *s) {
  int n = 0;

  CHECK_DIE(std::strlen(s) >= 3
            && s[0] == '0' && (s[1] == 'x' || s[1] == 'X'))
      << "no hex value: " << s;

  const char *p = s;
  s += 2;
  while (*s) {
    int r = 0;
    if (*s >= '0' && *s <= '9')
      r = *s - '0';
    else if (*s >= 'A' && *s <= 'F')
      r = *s - 'A' + 10;
    else if (*s >= 'a' && *s <= 'f')
      r = *s - 'a' + 10;
    else
      CHECK_DIE(false) << "no hex value: " << p;

    n = 16 * n + r;
    s++;
  }

  return n;
}